

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

int ON_FontList::CompareWeightStretchStyle(ON_Font **lhs,ON_Font **rhs)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar3 = 0;
  if (lhs != rhs) {
    if (lhs == (ON_Font **)0x0) {
      iVar3 = 1;
    }
    else {
      if (rhs == (ON_Font **)0x0) {
        return -1;
      }
      pOVar1 = *lhs;
      pOVar2 = *rhs;
      iVar3 = 0;
      if ((((pOVar1 != pOVar2) && (iVar3 = 1, pOVar1 != (ON_Font *)0x0)) &&
          (iVar3 = -1, pOVar2 != (ON_Font *)0x0)) &&
         ((iVar3 = (uint)pOVar1->m_font_style - (uint)pOVar2->m_font_style, iVar3 == 0 &&
          (iVar3 = (uint)pOVar1->m_font_stretch - (uint)pOVar2->m_font_stretch, iVar3 == 0)))) {
        uVar5 = pOVar1->m_windows_logfont_weight;
        if (900 < pOVar1->m_windows_logfont_weight - 100U) {
          uVar4 = 400;
          if (pOVar1->m_font_weight != 0) {
            uVar4 = (uint)pOVar1->m_font_weight * 100;
          }
          uVar6 = 900;
          if (uVar4 < 0x352) {
            uVar6 = uVar4;
          }
          uVar5 = 100;
          if (0x95 < uVar4) {
            uVar5 = uVar6;
          }
        }
        uVar4 = pOVar2->m_windows_logfont_weight;
        if (900 < pOVar2->m_windows_logfont_weight - 100U) {
          uVar6 = 400;
          if (pOVar2->m_font_weight != 0) {
            uVar6 = (uint)pOVar2->m_font_weight * 100;
          }
          uVar7 = 900;
          if (uVar6 < 0x352) {
            uVar7 = uVar6;
          }
          uVar4 = 100;
          if (0x95 < uVar6) {
            uVar4 = uVar7;
          }
        }
        return uVar5 - uVar4;
      }
    }
  }
  return iVar3;
}

Assistant:

int ON_FontList::CompareWeightStretchStyle(
  ON_Font const* const* lhs, 
  ON_Font const* const* rhs
  )
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);

  int rc;

  // Upright first, Italic 2nd, Oblique last

  // slope
  const int lhs_font_style = (int)static_cast<unsigned char>(lhs_font->FontStyle());
  const int rhs_font_style = (int)static_cast<unsigned char>(rhs_font->FontStyle());
  rc = (lhs_font_style - rhs_font_style);
  if (0 != rc)
    return rc;

  // width
  const int lhs_font_stretch = (int)static_cast<unsigned char>(lhs_font->FontStretch());
  const int rhs_font_stretch = (int)static_cast<unsigned char>(rhs_font->FontStretch());
  rc = (lhs_font_stretch - rhs_font_stretch);
  if (0 != rc)
    return rc;

  // weight
  const int lhs_font_weight = lhs_font->WindowsLogfontWeight();
  const int rhs_font_weight = rhs_font->WindowsLogfontWeight();
  rc = (lhs_font_weight - rhs_font_weight);
  if (0 != rc)
    return rc;

  return 0;
}